

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-paint.c
# Opt level: O3

plutovg_paint_t * plutovg_paint_create_rgba(float r,float g,float b,float a)

{
  plutovg_paint_t *ppVar1;
  undefined1 auVar2 [16];
  
  ppVar1 = (plutovg_paint_t *)malloc(0x18);
  ppVar1->ref_count = 1;
  ppVar1->type = PLUTOVG_PAINT_TYPE_COLOR;
  auVar2._4_4_ = g;
  auVar2._0_4_ = r;
  auVar2._8_4_ = b;
  auVar2._12_4_ = a;
  auVar2 = minps(_DAT_00122800,auVar2);
  ppVar1[1].ref_count = -(uint)(0.0 <= r) & auVar2._0_4_;
  ppVar1[1].type = -(uint)(0.0 <= g) & auVar2._4_4_;
  ppVar1[2].ref_count = -(uint)(0.0 <= b) & auVar2._8_4_;
  ppVar1[2].type = -(uint)(0.0 <= a) & auVar2._12_4_;
  return ppVar1;
}

Assistant:

plutovg_paint_t* plutovg_paint_create_rgba(float r, float g, float b, float a)
{
    plutovg_solid_paint_t* solid = plutovg_paint_create(PLUTOVG_PAINT_TYPE_COLOR, sizeof(plutovg_solid_paint_t));
    solid->color.r = plutovg_clamp(r, 0.f, 1.f);
    solid->color.g = plutovg_clamp(g, 0.f, 1.f);
    solid->color.b = plutovg_clamp(b, 0.f, 1.f);
    solid->color.a = plutovg_clamp(a, 0.f, 1.f);
    return &solid->base;
}